

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synapse.cxx
# Opt level: O0

void __thiscall SimpleSynapse::prepareNextState(SimpleSynapse *this)

{
  bool bVar1;
  uint uVar2;
  EVP_PKEY_CTX *in_RSI;
  SimpleSynapse *this_local;
  
  if (((this->super_Synapse).simplePreNeuron == (StochasticEventGenerator *)0x0) ||
     (uVar2 = (*(((this->super_Synapse).simplePreNeuron)->super_StochasticVariable).
                super_StochasticProcess.super_Parametric._vptr_Parametric[0xf])(), (uVar2 & 1) == 0)
     ) {
    DifferentialEquation::prepareNextState(&this->differential);
    bVar1 = StochasticProcess::isNextStatePrepared((StochasticProcess *)&this->differential);
    (this->super_Synapse).super_StochasticFunction.super_StochasticProcess.stochNextStateIsPrepared
         = bVar1;
  }
  else {
    DifferentialEquation::init(&this->differential,in_RSI);
    (this->super_Synapse).super_StochasticFunction.super_StochasticProcess.stochNextStateIsPrepared
         = true;
  }
  return;
}

Assistant:

void SimpleSynapse::prepareNextState()
{
	if( simplePreNeuron && simplePreNeuron->hasEvent() ) {
		differential.init();
		stochNextStateIsPrepared = true;
	} else {
		differential.prepareNextState();
		stochNextStateIsPrepared = differential.isNextStatePrepared();
	}
}